

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenSolver.h
# Opt level: O0

complex<double> Eigen::cdiv<double>(double *xr,double *xi,double *yr,double *yi)

{
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  double *pdVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar4;
  double dVar5;
  complex<double> cVar6;
  double d;
  double r;
  double *yi_local;
  double *yr_local;
  double *xi_local;
  double *xr_local;
  
  pdVar3 = xr;
  std::abs((int)xr);
  std::abs((int)pdVar3);
  if (extraout_XMM0_Qa <= extraout_XMM0_Qa_00) {
    dVar4 = *yr / *yi;
    dVar5 = dVar4 * *yr + *yi;
    std::complex<double>::complex
              ((complex<double> *)&xr_local,(dVar4 * *xr + *xi) / dVar5,(dVar4 * *xi + -*xr) / dVar5
              );
    uVar1 = extraout_RAX_00;
    uVar2 = extraout_RDX_00;
  }
  else {
    dVar4 = *yi / *yr;
    dVar5 = dVar4 * *yi + *yr;
    std::complex<double>::complex
              ((complex<double> *)&xr_local,(dVar4 * *xi + *xr) / dVar5,(-dVar4 * *xr + *xi) / dVar5
              );
    uVar1 = extraout_RAX;
    uVar2 = extraout_RDX;
  }
  cVar6._M_value._8_8_ = uVar2;
  cVar6._M_value._0_8_ = uVar1;
  return (complex<double>)cVar6._M_value;
}

Assistant:

std::complex<Scalar> cdiv(const Scalar& xr, const Scalar& xi, const Scalar& yr, const Scalar& yi)
{
  using std::abs;
  Scalar r,d;
  if (abs(yr) > abs(yi))
  {
      r = yi/yr;
      d = yr + r*yi;
      return std::complex<Scalar>((xr + r*xi)/d, (xi - r*xr)/d);
  }
  else
  {
      r = yr/yi;
      d = yi + r*yr;
      return std::complex<Scalar>((r*xr + xi)/d, (r*xi - xr)/d);
  }
}